

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeArrayValue(StyledWriter *this,Value *value)

{
  String *pSVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *root;
  ulong uVar4;
  ArrayIndex index;
  long lVar5;
  allocator<char> local_69;
  String local_68;
  String *local_48;
  pointer local_40;
  pointer local_38;
  
  AVar3 = Value::size(value);
  if (AVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"[]",&local_69);
    pushValue(this,&local_68);
  }
  else {
    uVar4 = (ulong)AVar3;
    bVar2 = isMultilineArray(this,value);
    if (!bVar2) {
      if ((long)(this->childValues_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->childValues_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar4) {
        pSVar1 = &this->document_;
        std::__cxx11::string::append((char *)pSVar1);
        for (lVar5 = 0; uVar4 << 5 != lVar5; lVar5 = lVar5 + 0x20) {
          if (lVar5 != 0) {
            std::__cxx11::string::append((char *)pSVar1);
          }
          std::__cxx11::string::append((string *)pSVar1);
        }
        std::__cxx11::string::append((char *)pSVar1);
        return;
      }
      __assert_fail("childValues_.size() == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                    ,0x21d,"void Json::StyledWriter::writeArrayValue(const Value &)");
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"[",&local_69);
    writeWithIndent(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    indent(this);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = &this->document_;
    index = 0;
    lVar5 = 0;
    while( true ) {
      root = Value::operator[](value,index);
      writeCommentBeforeValue(this,root);
      if (local_38 == local_40) {
        writeIndent(this);
        writeValue(this,root);
      }
      else {
        writeWithIndent(this,(String *)
                             ((long)&(((this->childValues_).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar5));
      }
      if (uVar4 * 0x20 + -0x20 == lVar5) break;
      std::__cxx11::string::push_back((char)local_48);
      writeCommentAfterValueOnSameLine(this,root);
      lVar5 = lVar5 + 0x20;
      index = index + 1;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"]",&local_69);
    writeWithIndent(this,&local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void StyledWriter::writeArrayValue(const Value& value) {
  size_t size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultilineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      ArrayIndex index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      document_ += "[ ";
      for (size_t index = 0; index < size; ++index) {
        if (index > 0)
          document_ += ", ";
        document_ += childValues_[index];
      }
      document_ += " ]";
    }
  }
}